

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passpredict.cc
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  _List_node_base *p_Var2;
  DateTime end_date;
  DateTime start_date;
  list<PassDetails,_std::allocator<PassDetails>_> pass_list;
  TimeSpan local_5f8 [4];
  CoordGeodetic local_5d8;
  string local_5c0;
  string local_5a0;
  string local_580;
  stringstream ss;
  long local_550;
  undefined8 local_548 [2];
  uint auStack_538 [88];
  Tle tle;
  SGP4 sgp4;
  
  local_5d8.latitude = 0.8989738399880358;
  local_5d8.longitude = -0.002229440339424615;
  local_5d8.altitude = 0.05;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580,"GALILEO-PFM (GSAT0101)  ",(allocator<char> *)&sgp4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a0,
             "1 37846U 11060A   12293.53312491  .00000049  00000-0  00000-0 0  1435",
             (allocator<char> *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c0,
             "2 37846  54.7963 119.5777 0000994 319.0618  40.9779  1.70474628  6204",
             (allocator<char> *)local_5f8);
  libsgp4::Tle::Tle(&tle,&local_580,&local_5a0,&local_5c0);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_580);
  libsgp4::SGP4::SGP4(&sgp4,&tle);
  poVar1 = libsgp4::operator<<((ostream *)&std::cout,&tle);
  std::endl<char,std::char_traits<char>>(poVar1);
  start_date = libsgp4::DateTime::Now(true);
  end_date.m_encoded = start_date.m_encoded + 0x8cd0e3a000;
  pass_list.super__List_base<PassDetails,_std::allocator<PassDetails>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&pass_list;
  pass_list.super__List_base<PassDetails,_std::allocator<PassDetails>_>._M_impl._M_node._M_size = 0;
  pass_list.super__List_base<PassDetails,_std::allocator<PassDetails>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       pass_list.super__List_base<PassDetails,_std::allocator<PassDetails>_>._M_impl._M_node.
       super__List_node_base._M_next;
  poVar1 = std::operator<<((ostream *)&std::cout,"Start time: ");
  poVar1 = libsgp4::operator<<(poVar1,&start_date);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"End time  : ");
  poVar1 = libsgp4::operator<<(poVar1,&end_date);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  GeneratePassList_abi_cxx11_
            ((list<PassDetails,_std::allocator<PassDetails>_> *)&ss,&local_5d8,&sgp4,&start_date,
             &end_date,0xb4);
  std::__cxx11::list<PassDetails,_std::allocator<PassDetails>_>::_M_move_assign(&pass_list,&ss);
  std::__cxx11::_List_base<PassDetails,_std::allocator<PassDetails>_>::_M_clear
            ((_List_base<PassDetails,_std::allocator<PassDetails>_> *)&ss);
  if (pass_list.super__List_base<PassDetails,_std::allocator<PassDetails>_>._M_impl._M_node.
      super__List_node_base._M_next == (_List_node_base *)&pass_list) {
    poVar1 = std::operator<<((ostream *)&std::cout,"No passes found");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    *(uint *)((long)auStack_538 + *(long *)(local_550 + -0x18)) =
         *(uint *)((long)auStack_538 + *(long *)(local_550 + -0x18)) & 0xffffff4f | 0x80;
    *(undefined8 *)((long)local_548 + *(long *)(local_550 + -0x18)) = 1;
    *(uint *)((long)auStack_538 + *(long *)(local_550 + -0x18)) =
         *(uint *)((long)auStack_538 + *(long *)(local_550 + -0x18)) & 0xfffffefb | 4;
    p_Var2 = pass_list.super__List_base<PassDetails,_std::allocator<PassDetails>_>._M_impl._M_node.
             super__List_node_base._M_next;
    do {
      poVar1 = std::operator<<((ostream *)&local_550,"AOS: ");
      poVar1 = libsgp4::operator<<(poVar1,(DateTime *)(p_Var2 + 1));
      poVar1 = std::operator<<(poVar1,", LOS: ");
      poVar1 = libsgp4::operator<<(poVar1,(DateTime *)&p_Var2[1]._M_prev);
      poVar1 = std::operator<<(poVar1,", Max El: ");
      *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 4;
      poVar1 = std::ostream::_M_insert<double>
                         (((double)p_Var2[2]._M_next * 180.0) / 3.141592653589793);
      poVar1 = std::operator<<(poVar1,", Duration: ");
      local_5f8[0].m_ticks = (long)p_Var2[1]._M_prev - (long)p_Var2[1]._M_next;
      poVar1 = libsgp4::operator<<(poVar1,local_5f8);
      std::endl<char,std::char_traits<char>>(poVar1);
      p_Var2 = (((_List_base<PassDetails,_std::allocator<PassDetails>_> *)&p_Var2->_M_next)->_M_impl
               )._M_node.super__List_node_base._M_next;
    } while (p_Var2 != (_List_node_base *)&pass_list);
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)&std::cout,(string *)local_5f8);
    std::__cxx11::string::~string((string *)local_5f8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  std::__cxx11::_List_base<PassDetails,_std::allocator<PassDetails>_>::_M_clear
            (&pass_list.super__List_base<PassDetails,_std::allocator<PassDetails>_>);
  libsgp4::Tle::~Tle(&tle);
  return 0;
}

Assistant:

int main()
{
    libsgp4::CoordGeodetic geo(51.507406923983446, -0.12773752212524414, 0.05);
    libsgp4::Tle tle("GALILEO-PFM (GSAT0101)  ",
        "1 37846U 11060A   12293.53312491  .00000049  00000-0  00000-0 0  1435",
        "2 37846  54.7963 119.5777 0000994 319.0618  40.9779  1.70474628  6204");
    libsgp4::SGP4 sgp4(tle);

    std::cout << tle << std::endl;

    /*
     * generate 7 day schedule
     */
    libsgp4::DateTime start_date = libsgp4::DateTime::Now(true);
    libsgp4::DateTime end_date(start_date.AddDays(7.0));

    std::list<struct PassDetails> pass_list;

    std::cout << "Start time: " << start_date << std::endl;
    std::cout << "End time  : " << end_date << std::endl << std::endl;

    /*
     * generate passes
     */
    pass_list = GeneratePassList(geo, sgp4, start_date, end_date, 180);

    if (pass_list.begin() == pass_list.end())
    {
        std::cout << "No passes found" << std::endl;
    }
    else
    {
        std::stringstream ss;

        ss << std::right << std::setprecision(1) << std::fixed;

        std::list<struct PassDetails>::const_iterator itr = pass_list.begin();
        do
        {
            ss  << "AOS: " << itr->aos
                << ", LOS: " << itr->los
                << ", Max El: " << std::setw(4) << libsgp4::Util::RadiansToDegrees(itr->max_elevation)
                << ", Duration: " << (itr->los - itr->aos)
                << std::endl;
        }
        while (++itr != pass_list.end());

        std::cout << ss.str();
    }

    return 0;
}